

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O0

commonNaNT * float32ToCommonNaN(commonNaNT *__return_storage_ptr__,float32 a,float_status *status)

{
  int iVar1;
  float_status *status_local;
  float32 a_local;
  
  iVar1 = float32_is_signaling_nan_tricore(a,status);
  if (iVar1 != 0) {
    float_raise_tricore('\x01',status);
  }
  __return_storage_ptr__->sign = (byte)(a >> 0x1f);
  __return_storage_ptr__->low = 0;
  __return_storage_ptr__->high = (ulong)a << 0x29;
  return __return_storage_ptr__;
}

Assistant:

static commonNaNT float32ToCommonNaN(float32 a, float_status *status)
{
    commonNaNT z;

    if (float32_is_signaling_nan(a, status)) {
        float_raise(float_flag_invalid, status);
    }
    z.sign = float32_val(a) >> 31;
    z.low = 0;
    z.high = ((uint64_t)float32_val(a)) << 41;
    return z;
}